

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotStemsEx<ImPlot::GetterYs<float>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<float> *get_mark,GetterYRef *get_base)

{
  TransformerLogLog transformer;
  int iVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 col;
  long lVar6;
  int iVar7;
  float *pfVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ImPlotPoint local_a8;
  double local_98;
  ImU32 local_90;
  ImU32 local_8c;
  ImDrawList *local_88;
  uint local_80;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  double local_60;
  double local_58;
  float *local_50;
  float *local_48;
  double local_40;
  ImPlotContext *local_38;
  
  bVar5 = BeginItem(label_id,0);
  if (bVar5) {
    if ((GImPlot->FitThisFrame == true) && (0 < get_base->Count)) {
      iVar7 = 0;
      do {
        local_98 = (double)iVar7;
        local_a8.x = get_mark->XScale * local_98 + get_mark->X0;
        iVar9 = get_mark->Count;
        local_a8.y = (double)*(float *)((long)get_mark->Ys +
                                       (long)(((get_mark->Offset + iVar7) % iVar9 + iVar9) % iVar9)
                                       * (long)get_mark->Stride);
        FitPoint(&local_a8);
        local_a8.x = local_98 * get_base->XScale + get_base->X0;
        local_a8.y = get_base->YRef;
        FitPoint(&local_a8);
        iVar7 = iVar7 + 1;
      } while (iVar7 < get_base->Count);
    }
    pIVar4 = GImPlot;
    local_88 = GetPlotDrawList();
    if ((pIVar4->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar4->NextItemData).Colors);
      iVar7 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar7]) {
      case 0:
        local_a8.x = (double)CONCAT44(local_a8.x._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>
                  (get_mark,get_base,(TransformerLinLin *)&local_a8,local_88,
                   (pIVar4->NextItemData).LineWeight,col);
        break;
      case 1:
        local_a8.x = (double)CONCAT44(local_a8.x._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>
                  (get_mark,get_base,(TransformerLogLin *)&local_a8,local_88,
                   (pIVar4->NextItemData).LineWeight,col);
        break;
      case 2:
        local_a8.x = (double)CONCAT44(local_a8.x._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>
                  (get_mark,get_base,(TransformerLinLog *)&local_a8,local_88,
                   (pIVar4->NextItemData).LineWeight,col);
        break;
      case 3:
        local_a8.x = (double)CONCAT44(local_a8.x._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>
                  (get_mark,get_base,(TransformerLogLog *)&local_a8,local_88,
                   (pIVar4->NextItemData).LineWeight,col);
      }
    }
    iVar7 = (pIVar4->NextItemData).Marker;
    iVar9 = 0;
    if (iVar7 != -1) {
      iVar9 = iVar7;
    }
    local_8c = ImGui::GetColorU32((pIVar4->NextItemData).Colors + 2);
    local_90 = ImGui::GetColorU32((pIVar4->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar6 = (long)transformer.YAxis;
    local_38 = GImPlot;
    local_98 = (double)lVar6;
    switch(GImPlot->Scales[lVar6]) {
    case 0:
      iVar7 = get_mark->Count;
      if (0 < iVar7) {
        pfVar8 = get_mark->Ys;
        local_50 = (float *)get_mark->XScale;
        uVar15 = SUB84(local_50,0);
        uVar16 = (undefined4)((ulong)local_50 >> 0x20);
        dVar12 = get_mark->X0;
        iVar2 = get_mark->Offset;
        local_60 = (double)CONCAT44(local_60._4_4_,(pIVar4->NextItemData).MarkerSize);
        local_68 = CONCAT44(local_68._4_4_,(pIVar4->NextItemData).MarkerWeight);
        iVar1 = get_mark->Stride;
        local_70 = (ulong)iVar9;
        iVar9 = 0;
        dVar13 = 0.0;
        bVar5 = (pIVar4->NextItemData).RenderMarkerLine;
        local_78 = CONCAT44(local_78._4_4_,(uint)(pIVar4->NextItemData).RenderMarkerFill);
        local_58 = dVar12;
        local_48 = pfVar8;
        do {
          fVar10 = (float)((((double)CONCAT44(uVar16,uVar15) * dVar13 + dVar12) -
                           (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                          (double)GImPlot->PixelRange[lVar6].Min.x);
          fVar11 = (float)(((double)*(float *)((long)pfVar8 +
                                              (long)(((iVar2 + iVar9) % iVar7 + iVar7) % iVar7) *
                                              (long)iVar1) -
                           GImPlot->CurrentPlot->YAxis[lVar6].Range.Min) *
                           GImPlot->My[(long)local_98] + (double)GImPlot->PixelRange[lVar6].Min.y);
          local_a8.x = (double)CONCAT44(fVar11,fVar10);
          pIVar3 = local_38->CurrentPlot;
          if ((((pIVar3->PlotRect).Min.x <= fVar10) && ((pIVar3->PlotRect).Min.y <= fVar11)) &&
             ((fVar10 < (pIVar3->PlotRect).Max.x && (fVar11 < (pIVar3->PlotRect).Max.y)))) {
            local_40 = dVar13;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<float>>(ImPlot::GetterYs<float>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_70 * 8))
                      ((ulong)local_60 & 0xffffffff,local_68 & 0xffffffff,local_88,&local_a8,bVar5,
                       local_8c,local_78 & 0xffffffff,local_90);
            uVar15 = SUB84(local_50,0);
            uVar16 = (undefined4)((ulong)local_50 >> 0x20);
            pfVar8 = local_48;
            dVar12 = local_58;
            dVar13 = local_40;
          }
          dVar13 = dVar13 + 1.0;
          iVar9 = iVar9 + 1;
        } while (iVar7 != iVar9);
      }
      break;
    case 1:
      iVar7 = get_mark->Count;
      if (0 < iVar7) {
        local_50 = get_mark->Ys;
        local_58 = get_mark->XScale;
        local_60 = get_mark->X0;
        local_68 = (ulong)(uint)get_mark->Offset;
        local_70 = CONCAT44(local_70._4_4_,(pIVar4->NextItemData).MarkerSize);
        fVar10 = (pIVar4->NextItemData).MarkerWeight;
        iVar2 = get_mark->Stride;
        local_78 = (ulong)iVar9;
        iVar9 = 0;
        dVar12 = 0.0;
        local_7c = (uint)(pIVar4->NextItemData).RenderMarkerLine;
        local_80 = (uint)(pIVar4->NextItemData).RenderMarkerFill;
        do {
          pIVar4 = GImPlot;
          local_48 = (float *)(double)*(float *)((long)local_50 +
                                                (long)((((int)local_68 + iVar9) % iVar7 + iVar7) %
                                                      iVar7) * (long)iVar2);
          local_40 = dVar12;
          dVar13 = log10((local_58 * dVar12 + local_60) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar3 = pIVar4->CurrentPlot;
          dVar12 = (pIVar3->XAxis).Range.Min;
          fVar11 = (float)((((double)(float)(dVar13 / pIVar4->LogDenX) *
                             ((pIVar3->XAxis).Range.Max - dVar12) + dVar12) - dVar12) * pIVar4->Mx +
                          (double)pIVar4->PixelRange[lVar6].Min.x);
          fVar14 = (float)(((double)local_48 - pIVar3->YAxis[lVar6].Range.Min) *
                           pIVar4->My[(long)local_98] + (double)pIVar4->PixelRange[lVar6].Min.y);
          local_a8.x = (double)CONCAT44(fVar14,fVar11);
          pIVar3 = local_38->CurrentPlot;
          if ((((pIVar3->PlotRect).Min.x <= fVar11) && ((pIVar3->PlotRect).Min.y <= fVar14)) &&
             ((fVar11 < (pIVar3->PlotRect).Max.x && (fVar14 < (pIVar3->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<float>>(ImPlot::GetterYs<float>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_78 * 8))
                      (local_70 & 0xffffffff,fVar10,local_88,&local_a8,local_7c,local_8c,local_80,
                       local_90);
          }
          dVar12 = local_40 + 1.0;
          iVar9 = iVar9 + 1;
        } while (iVar7 != iVar9);
      }
      break;
    case 2:
      iVar7 = get_mark->Count;
      if (0 < iVar7) {
        local_50 = get_mark->Ys;
        local_58 = get_mark->XScale;
        local_60 = get_mark->X0;
        local_68 = (ulong)(uint)get_mark->Offset;
        local_70 = CONCAT44(local_70._4_4_,(pIVar4->NextItemData).MarkerSize);
        fVar10 = (pIVar4->NextItemData).MarkerWeight;
        iVar2 = get_mark->Stride;
        local_78 = (ulong)iVar9;
        iVar9 = 0;
        dVar12 = 0.0;
        local_7c = (uint)(pIVar4->NextItemData).RenderMarkerLine;
        local_80 = (uint)(pIVar4->NextItemData).RenderMarkerFill;
        do {
          pIVar4 = GImPlot;
          local_48 = (float *)(local_58 * dVar12 + local_60);
          local_40 = dVar12;
          dVar13 = log10((double)*(float *)((long)local_50 +
                                           (long)((((int)local_68 + iVar9) % iVar7 + iVar7) % iVar7)
                                           * (long)iVar2) /
                         GImPlot->CurrentPlot->YAxis[lVar6].Range.Min);
          pIVar3 = pIVar4->CurrentPlot;
          dVar12 = pIVar3->YAxis[lVar6].Range.Min;
          fVar14 = (float)(((double)local_48 - (pIVar3->XAxis).Range.Min) * pIVar4->Mx +
                          (double)pIVar4->PixelRange[lVar6].Min.x);
          fVar11 = (float)((((double)(float)(dVar13 / pIVar4->LogDenY[(long)local_98]) *
                             (pIVar3->YAxis[lVar6].Range.Max - dVar12) + dVar12) - dVar12) *
                           pIVar4->My[(long)local_98] + (double)pIVar4->PixelRange[lVar6].Min.y);
          local_a8.x = (double)CONCAT44(fVar11,fVar14);
          pIVar3 = local_38->CurrentPlot;
          if (((((pIVar3->PlotRect).Min.x <= fVar14) && ((pIVar3->PlotRect).Min.y <= fVar11)) &&
              (fVar14 < (pIVar3->PlotRect).Max.x)) && (fVar11 < (pIVar3->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<float>>(ImPlot::GetterYs<float>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_78 * 8))
                      (local_70 & 0xffffffff,fVar10,local_88,&local_a8,local_7c,local_8c,local_80,
                       local_90);
          }
          dVar12 = local_40 + 1.0;
          iVar9 = iVar9 + 1;
        } while (iVar7 != iVar9);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<float>>
                (*get_mark,transformer,local_88,iVar9,(pIVar4->NextItemData).MarkerSize,
                 (pIVar4->NextItemData).RenderMarkerLine,local_8c,
                 (pIVar4->NextItemData).MarkerWeight,(pIVar4->NextItemData).RenderMarkerFill,
                 local_90);
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}